

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O0

void __thiscall
tcu::LogNumber<long>::LogNumber
          (LogNumber<long> *this,string *name,string *desc,string *unit,qpKeyValueTag tag,long value
          )

{
  long value_local;
  qpKeyValueTag tag_local;
  string *unit_local;
  string *desc_local;
  string *name_local;
  LogNumber<long> *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  std::__cxx11::string::string((string *)&this->m_desc,(string *)desc);
  std::__cxx11::string::string((string *)&this->m_unit,(string *)unit);
  this->m_tag = tag;
  this->m_value = value;
  return;
}

Assistant:

LogNumber (const std::string& name, const std::string& desc, const std::string& unit, qpKeyValueTag tag, T value)
		: m_name	(name)
		, m_desc	(desc)
		, m_unit	(unit)
		, m_tag		(tag)
		, m_value	(value)
	{
	}